

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_output.c
# Opt level: O3

void diff_output(diff_output_t *output,int side,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  if (output->verbose != 0) {
    local_b0 = in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    ensure_header(output);
    if (output->file_name != (char *)0x0) {
      diff_output_file(output,' ',output->file_name,output->file_size,output->file_crc,
                       output->file_mtime);
      output->file_name = (char *)0x0;
    }
    printf("%c ",side);
    local_e8 = 0x3000000018;
    local_e0 = &ap[0].overflow_arg_area;
    local_d8 = local_c8;
    vprintf(fmt,&local_e8);
    putchar(10);
  }
  return;
}

Assistant:

void
diff_output(diff_output_t *output, int side, const char *fmt, ...) {
    va_list ap;

    if (!output->verbose) {
        return;
    }

    ensure_header(output);

    if (output->file_name != NULL) {
        diff_output_file(output, ' ', output->file_name, output->file_size, output->file_crc, output->file_mtime);
        output->file_name = NULL;
    }

    printf("%c ", side);
    va_start(ap, fmt);
    vprintf(fmt, ap);
    va_end(ap);
    printf("\n");
}